

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

void deqp::gles3::Performance::writeConditionalWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  poVar1 = std::operator<<((ostream *)stream,resultName);
  std::operator<<(poVar1," = ");
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      if (iVar2 == 0x40) {
        std::operator<<((ostream *)stream,";");
        return;
      }
      std::operator<<((ostream *)stream,"*");
    }
    std::operator<<((ostream *)stream,operandName);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static void writeConditionalWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 64;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << "*";

		stream << operandName;
	}

	stream << ";";
}